

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSources::ProcessSDESNormalItem
          (RTPSources *this,uint32_t ssrc,ItemType t,size_t itemlength,void *itemdata,
          RTPTime *receivetime,RTPAddress *senderaddress)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  RTPInternalSourceData *srcdat;
  bool local_4a;
  bool local_49;
  size_t local_48;
  RTPTime *local_40;
  RTPInternalSourceData *local_38;
  
  iVar3 = -0x43;
  if ((t - CNAME < 7) &&
     (local_40 = receivetime, iVar3 = GetRTCPSourceData(this,ssrc,senderaddress,&local_38,&local_49)
     , -1 < iVar3)) {
    if (local_38 == (RTPInternalSourceData *)0x0) {
      iVar3 = 0;
    }
    else {
      bVar1 = (local_38->super_RTPSourceData).receivedbye;
      bVar2 = (local_38->super_RTPSourceData).validated;
      local_48 = itemlength;
      iVar3 = RTPInternalSourceData::ProcessSDESItem
                        (local_38,(char)(t - CNAME) + '\x01',(uint8_t *)itemdata,itemlength,local_40
                         ,&local_4a);
      if ((((bVar2 != true) || ((bVar1 & 1U) != 0)) &&
          ((local_38->super_RTPSourceData).validated == true)) &&
         (((local_38->super_RTPSourceData).receivedbye & 1U) == 0)) {
        this->activecount = this->activecount + 1;
      }
      if (local_49 == true) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_38);
      }
      if (local_4a == true) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[5])
                  (this,local_38,senderaddress,itemdata,local_48);
      }
      if (-1 < iVar3) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xd])
                  (this,local_38,(ulong)t,itemdata,local_48);
      }
    }
  }
  return iVar3;
}

Assistant:

int RTPSources::ProcessSDESNormalItem(uint32_t ssrc,RTCPSDESPacket::ItemType t,size_t itemlength,
                          const void *itemdata,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created,cnamecollis;
	int status;
	uint8_t sdesid;
	bool prevactive;

	switch(t)
	{
	case RTCPSDESPacket::CNAME:
		sdesid = RTCP_SDES_ID_CNAME;
		break;
	case RTCPSDESPacket::NAME:
		sdesid = RTCP_SDES_ID_NAME;
		break;
	case RTCPSDESPacket::EMAIL:
		sdesid = RTCP_SDES_ID_EMAIL;
		break;
	case RTCPSDESPacket::PHONE:
		sdesid = RTCP_SDES_ID_PHONE;
		break;
	case RTCPSDESPacket::LOC:
		sdesid = RTCP_SDES_ID_LOCATION;
		break;
	case RTCPSDESPacket::TOOL:
		sdesid = RTCP_SDES_ID_TOOL;
		break;
	case RTCPSDESPacket::NOTE:
		sdesid = RTCP_SDES_ID_NOTE;
		break;
	default:
		return ERR_RTP_SOURCES_ILLEGALSDESTYPE;
	}	
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;

	prevactive = srcdat->IsActive();
	status = srcdat->ProcessSDESItem(sdesid,(const uint8_t *)itemdata,itemlength,receivetime,&cnamecollis);
	if (!prevactive && srcdat->IsActive())
		activecount++;
	
	// Call the callback
	if (created)
		OnNewSource(srcdat);
	if (cnamecollis)
		OnCNAMECollision(srcdat,senderaddress,(const uint8_t *)itemdata,itemlength);

	if (status >= 0)
		OnRTCPSDESItem(srcdat, t, itemdata, itemlength);
	
	return status;
}